

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateRowIndexDelete
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx,int iIdxNoSeek)

{
  ushort uVar1;
  Vdbe *p;
  uint local_74;
  Index *local_60;
  Index *pPk;
  Vdbe *v;
  Index *pPrior;
  Index *pIdx;
  int iPartIdxLabel;
  int r1;
  int i;
  int iIdxNoSeek_local;
  int *aRegIdx_local;
  int iIdxCur_local;
  int iDataCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pIdx._4_4_ = -1;
  v = (Vdbe *)0x0;
  p = pParse->pVdbe;
  r1 = iIdxNoSeek;
  _i = aRegIdx;
  aRegIdx_local._0_4_ = iIdxCur;
  aRegIdx_local._4_4_ = iDataCur;
  _iIdxCur_local = pTab;
  pTab_local = (Table *)pParse;
  if ((pTab->tabFlags & 0x20) == 0) {
    local_60 = (Index *)0x0;
  }
  else {
    local_60 = sqlite3PrimaryKeyIndex(pTab);
  }
  iPartIdxLabel = 0;
  for (pPrior = _iIdxCur_local->pIndex; pPrior != (Index *)0x0; pPrior = pPrior->pNext) {
    if ((((_i == (int *)0x0) || (_i[iPartIdxLabel] != 0)) && (pPrior != local_60)) &&
       ((int)aRegIdx_local + iPartIdxLabel != r1)) {
      pIdx._4_4_ = sqlite3GenerateIndexKey
                             ((Parse *)pTab_local,pPrior,aRegIdx_local._4_4_,0,1,(int *)&pIdx,
                              (Index *)v,pIdx._4_4_);
      if ((*(ushort *)&pPrior->field_0x63 >> 3 & 1) == 0) {
        uVar1 = pPrior->nColumn;
      }
      else {
        uVar1 = pPrior->nKeyCol;
      }
      local_74 = (uint)uVar1;
      sqlite3VdbeAddOp3(p,0x85,(int)aRegIdx_local + iPartIdxLabel,pIdx._4_4_,local_74);
      sqlite3ResolvePartIdxLabel((Parse *)pTab_local,(int)pIdx);
      v = (Vdbe *)pPrior;
    }
    iPartIdxLabel = iPartIdxLabel + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx,      /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
  int iIdxNoSeek     /* Do not delete from this cursor */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    if( iIdxCur+i==iIdxNoSeek ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
        &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
        pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}